

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_REG_RPTR(CodeGenGenericContext *ctx,x86Command op,x86XmmReg reg1,x86Size size,
                     x86Reg index,int multiplier,x86Reg base,uint shift)

{
  x86Argument arg;
  CodeGenGenericContext *pCVar1;
  bool bVar2;
  x86Argument local_130;
  uint local_10c;
  undefined1 auStack_108 [4];
  uint memIndex_4;
  undefined1 local_100 [56];
  x86XmmReg local_c8;
  uint local_c4;
  uint i;
  uint memIndex_3;
  uint local_9c;
  undefined1 local_98 [4];
  uint memIndex_2;
  uint local_74;
  undefined1 local_70 [4];
  uint memIndex_1;
  uint local_4c;
  undefined1 auStack_48 [4];
  uint memIndex;
  x86Argument newArg;
  x86Reg local_20;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  x86XmmReg reg1_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  newArg.ptrNum = multiplier;
  local_20 = index;
  multiplier_local = size;
  index_local = reg1;
  size_local = op;
  _reg1_local = ctx;
  CodeGenGenericContext::RedirectAddressComputation(ctx,&local_20,&newArg.ptrNum,&base,&shift);
  x86Argument::x86Argument
            ((x86Argument *)auStack_48,multiplier_local,local_20,newArg.ptrNum,base,shift);
  switch(size_local) {
  case 0x34:
  case 0x35:
    local_c4 = CodeGenGenericContext::MemFind(_reg1_local,(x86Argument *)auStack_48);
    if ((local_c4 != 0) &&
       (local_c4 = local_c4 - 1, _reg1_local->memCache[local_c4].value.type == argXmmReg)) {
      EMIT_OP_REG_REG(_reg1_local,size_local,index_local,
                      _reg1_local->memCache[local_c4].value.field_1.xmmArg);
      return;
    }
    for (local_c8 = rXMM0; local_c8 < rXmmRegCount; local_c8 = local_c8 + rXMM1) {
      if ((_reg1_local->xmmReg[local_c8].type == argPtr) &&
         (bVar2 = x86Argument::operator==(_reg1_local->xmmReg + local_c8,(x86Argument *)auStack_48),
         bVar2)) {
        EMIT_OP_REG_REG(_reg1_local,size_local,index_local,local_c8);
        return;
      }
    }
    CodeGenGenericContext::ReadRegister(_reg1_local,base);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_20);
    pCVar1 = _reg1_local;
    x86Argument::x86Argument
              ((x86Argument *)(local_100 + 0x18),multiplier_local,local_20,newArg.ptrNum,base,shift)
    ;
    CodeGenGenericContext::MemRead(pCVar1,(x86Argument *)(local_100 + 0x18));
    auStack_108 = auStack_48;
    memIndex_4 = memIndex;
    local_100._0_8_ = newArg._0_8_;
    local_100._8_8_ = newArg.field_1;
    local_100._16_4_ = newArg.ptrBase;
    local_100._20_4_ = newArg.ptrIndex;
    arg.field_1 = (anon_union_8_6_73be8994_for_x86Argument_2)newArg._0_8_;
    arg.type = (ArgType)auStack_48;
    arg._4_4_ = memIndex;
    arg.ptrBase = newArg.field_1._0_4_;
    arg.ptrIndex = newArg.field_1._4_4_;
    arg.ptrMult = newArg.ptrBase;
    arg.ptrNum = newArg.ptrIndex;
    CodeGenGenericContext::OverwriteRegisterWithValue(_reg1_local,index_local,arg);
    break;
  default:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x6b8,
                  "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86XmmReg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                 );
  case 0x38:
  case 0x39:
    local_4c = CodeGenGenericContext::MemFind(_reg1_local,(x86Argument *)auStack_48);
    if ((local_4c != 0) &&
       (local_4c = local_4c - 1, _reg1_local->memCache[local_4c].value.type == argXmmReg)) {
      EMIT_OP_REG_REG(_reg1_local,size_local,index_local,
                      _reg1_local->memCache[local_4c].value.field_1.xmmArg);
      return;
    }
    CodeGenGenericContext::ReadRegister(_reg1_local,base);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_20);
    pCVar1 = _reg1_local;
    x86Argument::x86Argument
              ((x86Argument *)local_70,multiplier_local,local_20,newArg.ptrNum,base,shift);
    CodeGenGenericContext::MemRead(pCVar1,(x86Argument *)local_70);
    CodeGenGenericContext::OverwriteRegisterWithUnknown(_reg1_local,index_local);
    break;
  case 0x3b:
    local_74 = CodeGenGenericContext::MemFind(_reg1_local,(x86Argument *)auStack_48);
    if ((local_74 != 0) &&
       (local_74 = local_74 - 1, _reg1_local->memCache[local_74].value.type == argReg)) {
      if (_reg1_local->memCache[local_74].address.field_1.reg == rECX) {
        EMIT_OP_REG_REG(_reg1_local,size_local,index_local,
                        _reg1_local->memCache[local_74].value.field_1.reg);
        return;
      }
      __assert_fail("ctx.memCache[memIndex].address.ptrSize == sDWORD",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x657,
                    "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86XmmReg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                   );
    }
    CodeGenGenericContext::ReadRegister(_reg1_local,base);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_20);
    pCVar1 = _reg1_local;
    x86Argument::x86Argument
              ((x86Argument *)local_98,multiplier_local,local_20,newArg.ptrNum,base,shift);
    CodeGenGenericContext::MemRead(pCVar1,(x86Argument *)local_98);
    CodeGenGenericContext::OverwriteRegisterWithUnknown(_reg1_local,index_local);
    break;
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
    local_10c = CodeGenGenericContext::MemFind(_reg1_local,(x86Argument *)auStack_48);
    if ((local_10c != 0) &&
       (local_10c = local_10c - 1, _reg1_local->memCache[local_10c].value.type == argXmmReg)) {
      EMIT_OP_REG_REG(_reg1_local,size_local,index_local,
                      _reg1_local->memCache[local_10c].value.field_1.xmmArg);
      return;
    }
    CodeGenGenericContext::ReadRegister(_reg1_local,base);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_20);
    pCVar1 = _reg1_local;
    x86Argument::x86Argument(&local_130,multiplier_local,local_20,newArg.ptrNum,base,shift);
    CodeGenGenericContext::MemRead(pCVar1,&local_130);
    CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,index_local);
    break;
  case 0x5b:
    local_9c = CodeGenGenericContext::MemFind(_reg1_local,(x86Argument *)auStack_48);
    if ((local_9c != 0) &&
       (local_9c = local_9c - 1, _reg1_local->memCache[local_9c].value.type == argReg)) {
      if (_reg1_local->memCache[local_9c].address.field_1.reg == rEDX) {
        EMIT_OP_REG_REG(_reg1_local,size_local,index_local,
                        _reg1_local->memCache[local_9c].value.field_1.reg);
        return;
      }
      __assert_fail("ctx.memCache[memIndex].address.ptrSize == sQWORD",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x66d,
                    "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86XmmReg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                   );
    }
    CodeGenGenericContext::ReadRegister(_reg1_local,base);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_20);
    pCVar1 = _reg1_local;
    x86Argument::x86Argument((x86Argument *)&i,multiplier_local,local_20,newArg.ptrNum,base,shift);
    CodeGenGenericContext::MemRead(pCVar1,(x86Argument *)&i);
    CodeGenGenericContext::OverwriteRegisterWithUnknown(_reg1_local,index_local);
  }
  _reg1_local->x86Op->name = size_local;
  (_reg1_local->x86Op->argA).type = argXmmReg;
  (_reg1_local->x86Op->argA).field_1.reg = index_local;
  (_reg1_local->x86Op->argB).type = argPtr;
  (_reg1_local->x86Op->argB).field_1.num = multiplier_local;
  (_reg1_local->x86Op->argB).ptrIndex = local_20;
  (_reg1_local->x86Op->argB).ptrMult = newArg.ptrNum;
  (_reg1_local->x86Op->argB).ptrBase = base;
  (_reg1_local->x86Op->argB).ptrNum = shift;
  _reg1_local->x86Op = _reg1_local->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_RPTR(CodeGenGenericContext &ctx, x86Command op, x86XmmReg reg1, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift)
{
#ifdef NULLC_OPTIMIZE_X86
	ctx.RedirectAddressComputation(index, multiplier, base, shift);

	x86Argument newArg = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_cvtss2sd:
	case o_cvtsd2ss:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argXmmReg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.xmmArg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_cvtsi2sd:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argReg)
			{
				assert(ctx.memCache[memIndex].address.ptrSize == sDWORD);

				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.reg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_cvtsi2sd64:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argReg)
			{
				assert(ctx.memCache[memIndex].address.ptrSize == sQWORD);

				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.reg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_movss:
	case o_movsd:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argXmmReg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.xmmArg);
				return;
			}
		}

		// If another register contains data from memory
		for(unsigned i = 0; i < rXmmRegCount; i++)
		{
			if(ctx.xmmReg[i].type == x86Argument::argPtr && ctx.xmmReg[i] == newArg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, (x86XmmReg)i);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithValue(reg1, newArg);
		break;
	case o_addsd:
	case o_subsd:
	case o_mulsd:
	case o_divsd:
	case o_sqrtsd:
	case o_cmpeqsd:
	case o_cmpltsd:
	case o_cmplesd:
	case o_cmpneqsd:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argXmmReg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.xmmArg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.ReadAndModifyRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argXmmReg;
	ctx.x86Op->argA.xmmArg = reg1;
	ctx.x86Op->argB.type = x86Argument::argPtr;
	ctx.x86Op->argB.ptrSize = size;
	ctx.x86Op->argB.ptrIndex = index;
	ctx.x86Op->argB.ptrMult = multiplier;
	ctx.x86Op->argB.ptrBase = base;
	ctx.x86Op->argB.ptrNum = shift;
	ctx.x86Op++;
}